

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * util::text_cap(string *__return_storage_ptr__,string *string,int width,string *elipses)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  
  pcVar1 = (string->_M_dataplus)._M_p;
  sVar5 = string->_M_string_length;
  if (sVar5 == 0) {
LAB_0014be81:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar5);
    return __return_storage_ptr__;
  }
  iVar2 = 0;
  sVar4 = 0;
  while (iVar2 = iVar2 + *(int *)(sizes + (ulong)(byte)pcVar1[sVar4] * 4), iVar2 <= width) {
    sVar4 = sVar4 + 1;
    if (sVar5 == sVar4) goto LAB_0014be81;
  }
  if (elipses->_M_string_length == 0) {
    iVar3 = 0;
  }
  else {
    sVar5 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + *(int *)(sizes + (ulong)(byte)(elipses->_M_dataplus)._M_p[sVar5] * 4);
      sVar5 = sVar5 + 1;
    } while (elipses->_M_string_length != sVar5);
  }
  if (sVar4 != 0 && iVar3 + width < iVar2) {
    do {
      iVar2 = iVar2 - pcVar1[sVar4];
      if (iVar2 <= iVar3 + width) break;
      bVar6 = sVar4 != 1;
      sVar4 = sVar4 - 1;
    } while (bVar6);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)string);
  return __return_storage_ptr__;
}

Assistant:

std::string text_cap(const std::string& string, int width, const std::string& elipses)
{
	int length = 0;

	for (std::size_t i = 0; i < string.length(); ++i)
	{
		length += sizes[string[i] & 0xFF];

		if (length > width)
		{
			int elipses_length = text_width(elipses);

			while (length > (width + elipses_length) && i > 0)
			{
				length -= string[i];
				--i;
			}

			return string.substr(0, i);
		}
	}

	return string;
}